

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O0

void hwnet::TCPSocket::onTimer(Ptr *t,Ptr *s)

{
  Poller *this;
  bool bVar1;
  bool bVar2;
  element_type *peVar3;
  ulong uVar4;
  shared_ptr<hwnet::Task> local_120;
  code *local_110;
  undefined8 local_108;
  type local_100;
  value_type local_d0;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_b0;
  duration<long,_std::ratio<1L,_1000000000L>_> local_a8 [3];
  code *local_90;
  undefined8 local_88;
  type local_80;
  value_type local_50;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_30;
  duration<long,_std::ratio<1L,_1000000000L>_> local_28;
  byte local_19;
  Ptr *pPStack_18;
  bool post;
  Ptr *s_local;
  Ptr *t_local;
  
  local_19 = 0;
  pPStack_18 = s;
  s_local = (Ptr *)t;
  peVar3 = std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)s);
  std::mutex::lock(&peVar3->mtx);
  peVar3 = std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)s);
  bVar1 = false;
  if (peVar3->sendTimeout != 0) {
    peVar3 = std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)s);
    bVar2 = std::function::operator_cast_to_bool((function *)&peVar3->sendTimeoutCallback_);
    bVar1 = false;
    if (bVar2) {
      peVar3 = std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)s);
      bVar2 = linklist::empty(peVar3->ptrSendlist);
      bVar1 = false;
      if (!bVar2) {
        local_30.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
        peVar3 = std::
                 __shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)s);
        local_28.__r = (rep)std::chrono::operator-(&local_30,&peVar3->lastSendTime);
        uVar4 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_28);
        peVar3 = std::
                 __shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)s);
        bVar1 = peVar3->sendTimeout * 1000000 < uVar4;
      }
    }
  }
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)s);
    local_90 = checkTimeout;
    local_88 = 0;
    std::
    bind<void(hwnet::TCPSocket::*)(std::shared_ptr<hwnet::util::Timer>),std::shared_ptr<hwnet::TCPSocket>&,std::shared_ptr<hwnet::util::Timer>const&>
              (&local_80,(offset_in_TCPSocket_to_subr *)&local_90,s,
               (shared_ptr<hwnet::util::Timer> *)s_local);
    std::function<void()>::
    function<std::_Bind<void(hwnet::TCPSocket::*(std::shared_ptr<hwnet::TCPSocket>,std::shared_ptr<hwnet::util::Timer>))(std::shared_ptr<hwnet::util::Timer>)>,void>
              ((function<void()> *)&local_50,&local_80);
    std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::push_back
              (&peVar3->closures,&local_50);
    std::function<void_()>::~function(&local_50);
    std::
    _Bind<void_(hwnet::TCPSocket::*(std::shared_ptr<hwnet::TCPSocket>,_std::shared_ptr<hwnet::util::Timer>))(std::shared_ptr<hwnet::util::Timer>)>
    ::~_Bind(&local_80);
    peVar3 = std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)s);
    if ((peVar3->doing & 1U) == 0) {
      peVar3 = std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)s);
      peVar3->doing = true;
      local_19 = 1;
    }
  }
  peVar3 = std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)s);
  bVar1 = false;
  if (peVar3->recvTimeout != 0) {
    peVar3 = std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)s);
    bVar2 = std::function::operator_cast_to_bool((function *)&peVar3->recvTimeoutCallback_);
    bVar1 = false;
    if (bVar2) {
      peVar3 = std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)s);
      bVar2 = recvListEmpty(peVar3);
      bVar1 = false;
      if (!bVar2) {
        local_b0.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
        peVar3 = std::
                 __shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)s);
        local_a8[0].__r = (rep)std::chrono::operator-(&local_b0,&peVar3->lastRecvTime);
        uVar4 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(local_a8);
        peVar3 = std::
                 __shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)s);
        bVar1 = peVar3->recvTimeout * 1000000 < uVar4;
      }
    }
  }
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)s);
    local_110 = checkTimeout;
    local_108 = 0;
    std::
    bind<void(hwnet::TCPSocket::*)(std::shared_ptr<hwnet::util::Timer>),std::shared_ptr<hwnet::TCPSocket>&,std::shared_ptr<hwnet::util::Timer>const&>
              (&local_100,(offset_in_TCPSocket_to_subr *)&local_110,s,
               (shared_ptr<hwnet::util::Timer> *)s_local);
    std::function<void()>::
    function<std::_Bind<void(hwnet::TCPSocket::*(std::shared_ptr<hwnet::TCPSocket>,std::shared_ptr<hwnet::util::Timer>))(std::shared_ptr<hwnet::util::Timer>)>,void>
              ((function<void()> *)&local_d0,&local_100);
    std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::push_back
              (&peVar3->closures,&local_d0);
    std::function<void_()>::~function(&local_d0);
    std::
    _Bind<void_(hwnet::TCPSocket::*(std::shared_ptr<hwnet::TCPSocket>,_std::shared_ptr<hwnet::util::Timer>))(std::shared_ptr<hwnet::util::Timer>)>
    ::~_Bind(&local_100);
    peVar3 = std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)s);
    if ((peVar3->doing & 1U) == 0) {
      peVar3 = std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)s);
      peVar3->doing = true;
      local_19 = 1;
    }
  }
  peVar3 = std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)s);
  std::mutex::unlock(&peVar3->mtx);
  if ((local_19 & 1) != 0) {
    peVar3 = std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)s);
    this = peVar3->poller_;
    std::shared_ptr<hwnet::Task>::shared_ptr<hwnet::TCPSocket,void>(&local_120,s);
    peVar3 = std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)s);
    Poller::PostTask(this,&local_120,peVar3->pool_);
    std::shared_ptr<hwnet::Task>::~shared_ptr(&local_120);
  }
  return;
}

Assistant:

void TCPSocket::onTimer(const hwnet::util::Timer::Ptr &t,TCPSocket::Ptr s) {
	auto post = false;

	s->mtx.lock();
	
	if(s->sendTimeout > 0 && 
	   s->sendTimeoutCallback_ && !s->ptrSendlist->empty() &&
	   (util::milliseconds)((std::chrono::steady_clock::now() - s->lastSendTime).count()) > s->sendTimeout*1000000) {
		s->closures.push_back(std::bind(&TCPSocket::checkTimeout, s,t));
		if(!s->doing){
			s->doing = true;
			post = true;
		}
	}

	if(s->recvTimeout > 0 && 
	   s->recvTimeoutCallback_ && !s->recvListEmpty() &&
	   (util::milliseconds)((std::chrono::steady_clock::now() - s->lastRecvTime).count()) > s->recvTimeout*1000000) {
		s->closures.push_back(std::bind(&TCPSocket::checkTimeout, s,t));
		if(!s->doing){
			s->doing = true;
			post = true;
		}
	}


	s->mtx.unlock();

	if(post) {
		s->poller_->PostTask(s,s->pool_);
	}

}